

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O1

int Cof_ManTfiSize(Cof_Man_t *p,Cof_Obj_t **ppObjs,int nObjs)

{
  int iVar1;
  int iVar2;
  Cof_Obj_t *pObj;
  ulong uVar3;
  
  p->nTravIds = p->nTravIds + 1;
  if (nObjs < 1) {
    iVar2 = 0;
  }
  else {
    uVar3 = 0;
    iVar2 = 0;
    do {
      pObj = ppObjs[uVar3];
      if (((undefined1  [24])*pObj & (undefined1  [24])0xf1) == (undefined1  [24])0x11) {
        pObj = (Cof_Obj_t *)((long)pObj + (ulong)(*(uint *)(pObj + 1) & 0x7fffffff) * -4);
      }
      iVar1 = Cof_ManTfiSize_rec(p,pObj);
      iVar2 = iVar2 + iVar1;
      uVar3 = uVar3 + 1;
    } while ((uint)nObjs != uVar3);
  }
  return iVar2;
}

Assistant:

int Cof_ManTfiSize( Cof_Man_t * p, Cof_Obj_t ** ppObjs, int nObjs )
{
    int i, Counter = 0; 
    Cof_ManIncrementTravId( p );
    for ( i = 0; i < nObjs; i++ )
        if ( Cof_ObjIsCo(ppObjs[i]) )
            Counter += Cof_ManTfiSize_rec( p, Cof_ObjFanin(ppObjs[i],0) );
        else
            Counter += Cof_ManTfiSize_rec( p, ppObjs[i] );
    return Counter;
}